

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O2

void __thiscall wasm::PostEmscripten::removeEmJsExports(PostEmscripten *this,Module *module)

{
  pointer puVar1;
  value_type *__x;
  pointer puVar2;
  Global *pGVar3;
  pointer puVar4;
  Function *pFVar5;
  pointer puVar6;
  ElementSegment *pEVar7;
  pointer ppEVar8;
  pointer puVar9;
  DataSegment *pDVar10;
  pointer pEVar11;
  bool bVar12;
  string_view *psVar13;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  pointer ppEVar14;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  pointer puVar15;
  pointer puVar16;
  string_view *psVar17;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr_1;
  pointer puVar18;
  pointer puVar19;
  pointer puVar20;
  string_view prefix;
  string_view prefix_00;
  undefined1 auStack_148 [8];
  EmJsWalker walker;
  Expression *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_148,"post-emscripten-side-module",(allocator<char> *)&local_38);
  bVar12 = Pass::hasArgument(&this->super_Pass,(string *)auStack_148);
  std::__cxx11::string::~string((string *)auStack_148);
  auStack_148 = (undefined1  [8])0x0;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .replacep = (Expression **)0x0;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.sideModule = false;
  walker._217_7_ = 0;
  walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  puVar1 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .currFunction = (Function *)module;
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .currModule._0_1_ = bVar12;
  for (puVar15 = (module->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar1; puVar15 = puVar15 + 1
      ) {
    __x = (puVar15->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
          super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if ((char)walker.
              super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
              .currModule == '\0') {
      prefix._M_str = DAT_01175da8;
      prefix._M_len = wasm::(anonymous_namespace)::EM_JS_PREFIX;
      bVar12 = IString::startsWith((IString *)__x,prefix);
      if (bVar12) {
        std::vector<wasm::Export,_std::allocator<wasm::Export>_>::push_back
                  ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&walker.sideModule,__x);
      }
    }
    prefix_00._M_str = DAT_01175db8;
    prefix_00._M_len = wasm::(anonymous_namespace)::EM_JS_DEPS_PREFIX;
    bVar12 = IString::startsWith((IString *)__x,prefix_00);
    if (bVar12) {
      std::vector<wasm::Export,_std::allocator<wasm::Export>_>::push_back
                ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)&walker.sideModule,__x);
    }
  }
  puVar2 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar18 = (module->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar2; puVar18 = puVar18 + 1
      ) {
    pGVar3 = (puVar18->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
      Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
      ::walk((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
              *)auStack_148,&pGVar3->init);
    }
  }
  puVar4 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar19 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar4; puVar19 = puVar19 + 1
      ) {
    pFVar5 = (puVar19->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar5->super_Importable).module + 8) == (char *)0x0) {
      walker.
      super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pFVar5;
      Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
      ::walk((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
              *)auStack_148,&pFVar5->body);
      walker.
      super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
  }
  puVar6 = (module->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar16 = (module->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar6; puVar16 = puVar16 + 1
      ) {
    pEVar7 = (puVar16->_M_t).
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if (*(char **)((long)&(pEVar7->table).super_IString + 8) != (char *)0x0) {
      Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
      ::walk((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
              *)auStack_148,&pEVar7->offset);
    }
    ppEVar8 = *(pointer *)
               ((long)&(pEVar7->data).
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> +
               8);
    for (ppEVar14 = *(pointer *)
                     &(pEVar7->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl; ppEVar14 != ppEVar8; ppEVar14 = ppEVar14 + 1) {
      local_38 = *ppEVar14;
      Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
      ::walk((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
              *)auStack_148,&local_38);
    }
  }
  puVar9 = (module->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar20 = (module->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pEVar11 = walker.toRemove.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                _M_impl.super__Vector_impl_data._M_start, puVar20 != puVar9; puVar20 = puVar20 + 1)
  {
    pDVar10 = (puVar20->_M_t).
              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t
              .super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
              super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    if (pDVar10->isPassive == false) {
      Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
      ::walk((Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
              *)auStack_148,&pDVar10->offset);
    }
  }
  walker.
  super_PostWalker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::EmJsWalker,_wasm::Visitor<wasm::(anonymous_namespace)::EmJsWalker,_void>_>
  .currFunction = (Function *)0x0;
  psVar17 = (string_view *)(walker._216_8_ + 0x18);
  do {
    if ((pointer)&psVar17[-2]._M_str == pEVar11) {
      anon_unknown_0::EmJsWalker::~EmJsWalker((EmJsWalker *)auStack_148);
      return;
    }
    if (*(int *)&psVar17[-1]._M_str == 3) {
      psVar13 = psVar17;
      if ((char)psVar17[1]._M_len != '\0') {
        psVar13 = (string_view *)0x0;
      }
      Module::removeGlobal(module,(Name)*psVar13);
    }
    else {
      if (*(int *)&psVar17[-1]._M_str != 0) {
        __assert_fail("exp.kind == ExternalKind::Global",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/PostEmscripten.cpp"
                      ,0xf7,"void wasm::PostEmscripten::removeEmJsExports(Module &)");
      }
      psVar13 = psVar17;
      if ((char)psVar17[1]._M_len != '\0') {
        psVar13 = (string_view *)0x0;
      }
      Module::removeFunction(module,(Name)*psVar13);
    }
    Module::removeExport(module,(IString)*(IString *)&psVar17[-2]._M_str);
    psVar17 = psVar17 + 3;
  } while( true );
}

Assistant:

void removeEmJsExports(Module& module) {
    auto sideModule = hasArgument("post-emscripten-side-module");
    EmJsWalker walker(sideModule);
    walker.walkModule(&module);
    for (Export& exp : walker.toRemove) {
      if (exp.kind == ExternalKind::Function) {
        module.removeFunction(*exp.getInternalName());
      } else {
        assert(exp.kind == ExternalKind::Global);
        module.removeGlobal(*exp.getInternalName());
      }
      module.removeExport(exp.name);
    }
  }